

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat operator*(double value,Mat *Matrix)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  int *in_RSI;
  uint uVar4;
  double *pdVar5;
  Mat MVar6;
  
  uVar4 = in_RSI[1] * *in_RSI;
  Mat::Mat(Matrix,*in_RSI,in_RSI[1]);
  lVar1 = *(long *)(in_RSI + 2);
  pdVar2 = Matrix->v_;
  pdVar3 = (double *)0x0;
  pdVar5 = (double *)(ulong)uVar4;
  if ((int)uVar4 < 1) {
    pdVar5 = pdVar3;
  }
  for (; pdVar5 != pdVar3; pdVar3 = (double *)((long)pdVar3 + 1)) {
    pdVar2[(long)pdVar3] = *(double *)(lVar1 + (long)pdVar3 * 8) * value;
  }
  MVar6.v_ = pdVar3;
  MVar6._0_8_ = Matrix;
  return MVar6;
}

Assistant:

Mat operator*(double value, const Mat& Matrix)
{
	int nEl = Matrix.n_rows_*Matrix.n_cols_;
	Mat Aux(Matrix.n_rows_, Matrix.n_cols_);
	for (int i=0; i<nEl; i++) 	
		Aux.v_[i] = value*Matrix.v_[i];
	return Aux;
}